

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::SELU_x86_avx512::forward_inplace(SELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 (*pauVar11) [64];
  long lVar12;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar13 [16];
  undefined1 auVar24 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 extraout_var [60];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float afVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  float afVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 in_ZMM21 [64];
  undefined1 auVar58 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar59 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar30 [32];
  undefined1 auVar22 [16];
  
  iVar3 = bottom_top_blob->c;
  if (0 < (long)iVar3) {
    uVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    auVar31 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar32 = vxorps_avx512dq(auVar31,(undefined1  [64])::_ps512_cephes_exp_C1);
    auVar31 = vxorps_avx512dq(auVar31,(undefined1  [64])::_ps512_cephes_exp_C2);
    lVar12 = 0;
    auVar13 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
    auVar58 = ZEXT1664(auVar13);
    auVar13 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
    auVar59 = ZEXT1664(auVar13);
    auVar24 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
    auVar60 = ZEXT3264(auVar24);
    auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar61 = ZEXT3264(auVar24);
    auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
    auVar62 = ZEXT3264(auVar24);
    auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar64 = ZEXT3264(auVar24);
    auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
    auVar65 = ZEXT3264(auVar24);
    auVar24 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
    auVar66 = ZEXT3264(auVar24);
    auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
    auVar67 = ZEXT3264(auVar24);
    afVar45 = ::_ps512_1;
    afVar55 = ::_ps512_cephes_exp_p5;
    do {
      pauVar11 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * lVar12 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar10 < 0x10) {
        uVar8 = 0;
      }
      else {
        auVar33 = vbroadcastss_avx512f(ZEXT416((uint)(this->super_SELU).alpha));
        auVar34 = vbroadcastss_avx512f(ZEXT416((uint)(this->super_SELU).lambda));
        iVar6 = 0xf;
        do {
          auVar35 = vmaxps_avx512f(*pauVar11,auVar58);
          auVar36 = vminps_avx512f(*pauVar11,auVar58);
          auVar36 = vminps_avx512f(auVar36,(undefined1  [64])::_ps512_exp_hi);
          auVar36 = vmaxps_avx512f(auVar36,(undefined1  [64])::_ps512_exp_lo);
          auVar37 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar36,
                                        (undefined1  [64])afVar55);
          auVar38 = vrndscaleps_avx512f(auVar37,1);
          uVar5 = vcmpps_avx512f(auVar37,auVar38,1);
          auVar37 = vsubps_avx512f(auVar38,(undefined1  [64])afVar45);
          bVar4 = (bool)((byte)uVar5 & 1);
          auVar39._0_4_ = (uint)bVar4 * auVar37._0_4_ | (uint)!bVar4 * auVar38._0_4_;
          bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
          auVar39._4_4_ = (uint)bVar4 * auVar37._4_4_ | (uint)!bVar4 * auVar38._4_4_;
          bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
          auVar39._8_4_ = (uint)bVar4 * auVar37._8_4_ | (uint)!bVar4 * auVar38._8_4_;
          bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
          auVar39._12_4_ = (uint)bVar4 * auVar37._12_4_ | (uint)!bVar4 * auVar38._12_4_;
          bVar4 = (bool)((byte)(uVar5 >> 4) & 1);
          auVar39._16_4_ = (uint)bVar4 * auVar37._16_4_ | (uint)!bVar4 * auVar38._16_4_;
          bVar4 = (bool)((byte)(uVar5 >> 5) & 1);
          auVar39._20_4_ = (uint)bVar4 * auVar37._20_4_ | (uint)!bVar4 * auVar38._20_4_;
          bVar4 = (bool)((byte)(uVar5 >> 6) & 1);
          auVar39._24_4_ = (uint)bVar4 * auVar37._24_4_ | (uint)!bVar4 * auVar38._24_4_;
          bVar4 = (bool)((byte)(uVar5 >> 7) & 1);
          auVar39._28_4_ = (uint)bVar4 * auVar37._28_4_ | (uint)!bVar4 * auVar38._28_4_;
          bVar4 = (bool)((byte)(uVar5 >> 8) & 1);
          auVar39._32_4_ = (uint)bVar4 * auVar37._32_4_ | (uint)!bVar4 * auVar38._32_4_;
          bVar4 = (bool)((byte)(uVar5 >> 9) & 1);
          auVar39._36_4_ = (uint)bVar4 * auVar37._36_4_ | (uint)!bVar4 * auVar38._36_4_;
          bVar4 = (bool)((byte)(uVar5 >> 10) & 1);
          auVar39._40_4_ = (uint)bVar4 * auVar37._40_4_ | (uint)!bVar4 * auVar38._40_4_;
          bVar4 = (bool)((byte)(uVar5 >> 0xb) & 1);
          auVar39._44_4_ = (uint)bVar4 * auVar37._44_4_ | (uint)!bVar4 * auVar38._44_4_;
          bVar4 = (bool)((byte)(uVar5 >> 0xc) & 1);
          auVar39._48_4_ = (uint)bVar4 * auVar37._48_4_ | (uint)!bVar4 * auVar38._48_4_;
          bVar4 = (bool)((byte)(uVar5 >> 0xd) & 1);
          auVar39._52_4_ = (uint)bVar4 * auVar37._52_4_ | (uint)!bVar4 * auVar38._52_4_;
          bVar4 = (bool)((byte)(uVar5 >> 0xe) & 1);
          auVar39._56_4_ = (uint)bVar4 * auVar37._56_4_ | (uint)!bVar4 * auVar38._56_4_;
          bVar4 = SUB81(uVar5 >> 0xf,0);
          auVar39._60_4_ = (uint)bVar4 * auVar37._60_4_ | (uint)!bVar4 * auVar38._60_4_;
          auVar36 = vfmadd231ps_avx512f(auVar36,auVar39,auVar32);
          auVar36 = vfmadd231ps_avx512f(auVar36,auVar39,auVar31);
          auVar37 = vmulps_avx512f(auVar36,auVar36);
          auVar38 = vfmadd132ps_avx512f(auVar36,(undefined1  [64])::_ps512_cephes_exp_p1,
                                        (undefined1  [64])::_ps512_cephes_exp_p0);
          auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])::_ps512_cephes_exp_p2);
          auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])::_ps512_cephes_exp_p3);
          auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])::_ps512_cephes_exp_p4);
          auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])afVar55);
          auVar36 = vfmadd213ps_avx512f(auVar38,auVar37,auVar36);
          auVar37 = vaddps_avx512f(auVar36,(undefined1  [64])afVar45);
          auVar36 = vcvttps2dq_avx512f(auVar39);
          auVar36 = vpaddd_avx512f(auVar36,(undefined1  [64])::_pi32_512_0x7f);
          auVar38 = vpslld_avx512f(auVar36,0x17);
          auVar36._8_4_ = 0xbf800000;
          auVar36._0_8_ = 0xbf800000bf800000;
          auVar36._12_4_ = 0xbf800000;
          auVar36._16_4_ = 0xbf800000;
          auVar36._20_4_ = 0xbf800000;
          auVar36._24_4_ = 0xbf800000;
          auVar36._28_4_ = 0xbf800000;
          auVar36._32_4_ = 0xbf800000;
          auVar36._36_4_ = 0xbf800000;
          auVar36._40_4_ = 0xbf800000;
          auVar36._44_4_ = 0xbf800000;
          auVar36._48_4_ = 0xbf800000;
          auVar36._52_4_ = 0xbf800000;
          auVar36._56_4_ = 0xbf800000;
          auVar36._60_4_ = 0xbf800000;
          auVar36 = vfmadd213ps_avx512f(auVar38,auVar37,auVar36);
          auVar36 = vfmadd213ps_avx512f(auVar36,auVar33,auVar35);
          auVar36 = vmulps_avx512f(auVar36,auVar34);
          *pauVar11 = auVar36;
          pauVar11 = pauVar11 + 1;
          iVar6 = iVar6 + 0x10;
          uVar8 = uVar10 & 0xfffffff0;
        } while (iVar6 < (int)uVar10);
      }
      if ((int)(uVar8 | 7) < (int)uVar10) {
        fVar1 = (this->super_SELU).alpha;
        auVar24._4_4_ = fVar1;
        auVar24._0_4_ = fVar1;
        auVar24._8_4_ = fVar1;
        auVar24._12_4_ = fVar1;
        auVar24._16_4_ = fVar1;
        auVar24._20_4_ = fVar1;
        auVar24._24_4_ = fVar1;
        auVar24._28_4_ = fVar1;
        fVar1 = (this->super_SELU).lambda;
        auVar47._8_4_ = 0x3c088908;
        auVar47._0_8_ = 0x3c0889083c088908;
        auVar47._12_4_ = 0x3c088908;
        auVar47._16_4_ = 0x3c088908;
        auVar47._20_4_ = 0x3c088908;
        auVar47._24_4_ = 0x3c088908;
        auVar47._28_4_ = 0x3c088908;
        auVar49._8_4_ = 0x3d2aa9c1;
        auVar49._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar49._12_4_ = 0x3d2aa9c1;
        auVar49._16_4_ = 0x3d2aa9c1;
        auVar49._20_4_ = 0x3d2aa9c1;
        auVar49._24_4_ = 0x3d2aa9c1;
        auVar49._28_4_ = 0x3d2aa9c1;
        auVar51._8_4_ = 0x3e2aaaaa;
        auVar51._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar51._12_4_ = 0x3e2aaaaa;
        auVar51._16_4_ = 0x3e2aaaaa;
        auVar51._20_4_ = 0x3e2aaaaa;
        auVar51._24_4_ = 0x3e2aaaaa;
        auVar51._28_4_ = 0x3e2aaaaa;
        auVar53._8_4_ = 0x3f800000;
        auVar53._0_8_ = 0x3f8000003f800000;
        auVar53._12_4_ = 0x3f800000;
        auVar53._16_4_ = 0x3f800000;
        auVar53._20_4_ = 0x3f800000;
        auVar53._24_4_ = 0x3f800000;
        auVar53._28_4_ = 0x3f800000;
        uVar7 = uVar8;
        do {
          auVar25 = vmaxps_avx512vl(*(undefined1 (*) [32])*pauVar11,auVar59._0_32_);
          auVar26 = vminps_avx512vl(*(undefined1 (*) [32])*pauVar11,auVar59._0_32_);
          auVar27._8_4_ = 0x42b0c0a5;
          auVar27._0_8_ = 0x42b0c0a542b0c0a5;
          auVar27._12_4_ = 0x42b0c0a5;
          auVar27._16_4_ = 0x42b0c0a5;
          auVar27._20_4_ = 0x42b0c0a5;
          auVar27._24_4_ = 0x42b0c0a5;
          auVar27._28_4_ = 0x42b0c0a5;
          auVar27 = vminps_avx512vl(auVar26,auVar27);
          auVar26 = vmaxps_avx512vl(auVar27,auVar60._0_32_);
          auVar28 = vfmadd231ps_avx512vl(auVar61._0_32_,auVar26,auVar62._0_32_);
          auVar27 = vroundps_avx(auVar28,1);
          uVar5 = vcmpps_avx512vl(auVar28,auVar27,1);
          auVar63 = auVar64._0_32_;
          auVar29 = vsubps_avx512vl(auVar27,auVar63);
          bVar4 = (bool)((byte)uVar5 & 1);
          auVar30._0_4_ = (float)((uint)bVar4 * auVar29._0_4_ | (uint)!bVar4 * auVar27._0_4_);
          bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
          auVar30._4_4_ = (float)((uint)bVar4 * auVar29._4_4_ | (uint)!bVar4 * auVar27._4_4_);
          bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
          auVar30._8_4_ = (float)((uint)bVar4 * auVar29._8_4_ | (uint)!bVar4 * auVar27._8_4_);
          bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
          auVar30._12_4_ = (float)((uint)bVar4 * auVar29._12_4_ | (uint)!bVar4 * auVar27._12_4_);
          bVar4 = (bool)((byte)(uVar5 >> 4) & 1);
          auVar30._16_4_ = (float)((uint)bVar4 * auVar29._16_4_ | (uint)!bVar4 * auVar27._16_4_);
          bVar4 = (bool)((byte)(uVar5 >> 5) & 1);
          auVar30._20_4_ = (float)((uint)bVar4 * auVar29._20_4_ | (uint)!bVar4 * auVar27._20_4_);
          bVar4 = (bool)((byte)(uVar5 >> 6) & 1);
          auVar30._24_4_ = (float)((uint)bVar4 * auVar29._24_4_ | (uint)!bVar4 * auVar27._24_4_);
          bVar4 = SUB81(uVar5 >> 7,0);
          auVar30._28_4_ = (float)((uint)bVar4 * auVar29._28_4_ | (uint)!bVar4 * auVar27._28_4_);
          auVar27 = vfmsub231ps_avx512vl(auVar26,auVar30,auVar65._0_32_);
          auVar26._8_4_ = 0x395e8083;
          auVar26._0_8_ = 0x395e8083395e8083;
          auVar26._12_4_ = 0x395e8083;
          auVar26._16_4_ = 0x395e8083;
          auVar26._20_4_ = 0x395e8083;
          auVar26._24_4_ = 0x395e8083;
          auVar26._28_4_ = 0x395e8083;
          auVar27 = vfmsub231ps_avx512vl(auVar27,auVar30,auVar26);
          auVar29._4_4_ = auVar27._4_4_ * auVar27._4_4_;
          auVar29._0_4_ = auVar27._0_4_ * auVar27._0_4_;
          auVar29._8_4_ = auVar27._8_4_ * auVar27._8_4_;
          auVar29._12_4_ = auVar27._12_4_ * auVar27._12_4_;
          auVar29._16_4_ = auVar27._16_4_ * auVar27._16_4_;
          auVar29._20_4_ = auVar27._20_4_ * auVar27._20_4_;
          auVar29._24_4_ = auVar27._24_4_ * auVar27._24_4_;
          auVar29._28_4_ = auVar28._28_4_;
          auVar26 = vfmadd213ps_avx512vl(auVar66._0_32_,auVar27,auVar67._0_32_);
          auVar13 = vfmadd213ps_fma(auVar26,auVar27,auVar47);
          auVar13 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar27,auVar49);
          auVar13 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar27,auVar51);
          auVar26 = vfmadd213ps_avx512vl(ZEXT1632(auVar13),auVar27,auVar61._0_32_);
          auVar13 = vfmadd213ps_fma(auVar26,auVar29,auVar27);
          auVar26 = vaddps_avx512vl(ZEXT1632(auVar13),auVar63);
          auVar28._0_4_ = (int)auVar30._0_4_;
          auVar28._4_4_ = (int)auVar30._4_4_;
          auVar28._8_4_ = (int)auVar30._8_4_;
          auVar28._12_4_ = (int)auVar30._12_4_;
          auVar28._16_4_ = (int)auVar30._16_4_;
          auVar28._20_4_ = (int)auVar30._20_4_;
          auVar28._24_4_ = (int)auVar30._24_4_;
          auVar28._28_4_ = (int)auVar30._28_4_;
          auVar27 = vpslld_avx2(auVar28,0x17);
          auVar27 = vpaddd_avx2(auVar53,auVar27);
          auVar27 = vfmsub213ps_avx512vl(auVar27,auVar26,auVar63);
          auVar13 = vfmadd213ps_fma(auVar27,auVar24,auVar25);
          auVar25._4_4_ = auVar13._4_4_ * fVar1;
          auVar25._0_4_ = auVar13._0_4_ * fVar1;
          auVar25._8_4_ = auVar13._8_4_ * fVar1;
          auVar25._12_4_ = auVar13._12_4_ * fVar1;
          auVar25._16_4_ = fVar1 * 0.0;
          auVar25._20_4_ = fVar1 * 0.0;
          auVar25._24_4_ = fVar1 * 0.0;
          auVar25._28_4_ = auVar26._28_4_;
          *(undefined1 (*) [32])*pauVar11 = auVar25;
          pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x20);
          uVar8 = uVar7 + 8;
          iVar6 = uVar7 + 0xf;
          uVar7 = uVar8;
        } while (iVar6 < (int)uVar10);
      }
      if ((int)(uVar8 | 3) < (int)uVar10) {
        fVar1 = (this->super_SELU).alpha;
        auVar41._4_4_ = fVar1;
        auVar41._0_4_ = fVar1;
        auVar41._8_4_ = fVar1;
        auVar41._12_4_ = fVar1;
        fVar1 = (this->super_SELU).lambda;
        auVar46._8_4_ = 0x42b0c0a5;
        auVar46._0_8_ = 0x42b0c0a542b0c0a5;
        auVar46._12_4_ = 0x42b0c0a5;
        auVar48._8_4_ = 0xc2b0c0a5;
        auVar48._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar48._12_4_ = 0xc2b0c0a5;
        auVar50._8_4_ = 0x3f000000;
        auVar50._0_8_ = 0x3f0000003f000000;
        auVar50._12_4_ = 0x3f000000;
        auVar52._8_4_ = 0x3fb8aa3b;
        auVar52._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar52._12_4_ = 0x3fb8aa3b;
        auVar54._8_4_ = 0x3f800000;
        auVar54._0_8_ = 0x3f8000003f800000;
        auVar54._12_4_ = 0x3f800000;
        auVar56._8_4_ = 0x3f318000;
        auVar56._0_8_ = 0x3f3180003f318000;
        auVar56._12_4_ = 0x3f318000;
        auVar57._8_4_ = 0x395e8083;
        auVar57._0_8_ = 0x395e8083395e8083;
        auVar57._12_4_ = 0x395e8083;
        auVar13 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar14 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar15 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar16 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar17 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar18 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
        in_ZMM23 = ZEXT1664(auVar18);
        auVar19 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        uVar7 = uVar8;
        do {
          auVar20 = vmaxps_avx512vl(*(undefined1 (*) [16])*pauVar11,auVar18);
          auVar21 = vminps_avx512vl(*(undefined1 (*) [16])*pauVar11,auVar18);
          auVar21 = vminps_avx(auVar46,auVar21);
          auVar42 = vmaxps_avx(auVar48,auVar21);
          auVar22 = vfmadd231ps_fma(auVar50,auVar42,auVar52);
          auVar44._0_4_ = (int)auVar22._0_4_;
          auVar44._4_4_ = (int)auVar22._4_4_;
          auVar44._8_4_ = (int)auVar22._8_4_;
          auVar44._12_4_ = (int)auVar22._12_4_;
          auVar21 = vcvtdq2ps_avx(auVar44);
          uVar5 = vcmpps_avx512vl(auVar22,auVar21,1);
          auVar22 = vsubps_avx512vl(auVar21,auVar54);
          bVar4 = (bool)((byte)uVar5 & 1);
          auVar23._0_4_ = (float)((uint)bVar4 * auVar22._0_4_ | (uint)!bVar4 * auVar21._0_4_);
          bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
          auVar23._4_4_ = (float)((uint)bVar4 * auVar22._4_4_ | (uint)!bVar4 * auVar21._4_4_);
          bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
          auVar23._8_4_ = (float)((uint)bVar4 * auVar22._8_4_ | (uint)!bVar4 * auVar21._8_4_);
          bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
          auVar23._12_4_ = (float)((uint)bVar4 * auVar22._12_4_ | (uint)!bVar4 * auVar21._12_4_);
          auVar21 = vfmsub231ps_fma(auVar42,auVar23,auVar56);
          auVar42 = vfmsub231ps_fma(auVar21,auVar23,auVar57);
          auVar43._0_4_ = auVar42._0_4_ * auVar42._0_4_;
          auVar43._4_4_ = auVar42._4_4_ * auVar42._4_4_;
          auVar43._8_4_ = auVar42._8_4_ * auVar42._8_4_;
          auVar43._12_4_ = auVar42._12_4_ * auVar42._12_4_;
          auVar21 = vfmadd213ps_avx512vl(auVar13,auVar42,auVar14);
          auVar21 = vfmadd213ps_avx512vl(auVar21,auVar42,auVar15);
          auVar21 = vfmadd213ps_avx512vl(auVar21,auVar42,auVar16);
          auVar21 = vfmadd213ps_avx512vl(auVar21,auVar42,auVar17);
          auVar21 = vfmadd213ps_fma(auVar21,auVar42,auVar50);
          auVar21 = vfmadd213ps_fma(auVar21,auVar43,auVar42);
          auVar42._0_4_ = auVar21._0_4_ + 1.0;
          auVar42._4_4_ = auVar21._4_4_ + 1.0;
          auVar42._8_4_ = auVar21._8_4_ + 1.0;
          auVar42._12_4_ = auVar21._12_4_ + 1.0;
          auVar21._0_4_ = (int)auVar23._0_4_;
          auVar21._4_4_ = (int)auVar23._4_4_;
          auVar21._8_4_ = (int)auVar23._8_4_;
          auVar21._12_4_ = (int)auVar23._12_4_;
          auVar21 = vpslld_avx(auVar21,0x17);
          auVar21 = vpaddd_avx512vl(auVar21,auVar19);
          auVar21 = vfmsub213ps_fma(auVar21,auVar42,auVar54);
          auVar21 = vfmadd213ps_fma(auVar21,auVar41,auVar20);
          auVar22._0_4_ = auVar21._0_4_ * fVar1;
          auVar22._4_4_ = auVar21._4_4_ * fVar1;
          auVar22._8_4_ = auVar21._8_4_ * fVar1;
          auVar22._12_4_ = auVar21._12_4_ * fVar1;
          *(undefined1 (*) [16])*pauVar11 = auVar22;
          pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x10);
          uVar8 = uVar7 + 4;
          iVar6 = uVar7 + 7;
          uVar7 = uVar8;
        } while (iVar6 < (int)uVar10);
      }
      if (uVar10 - uVar8 != 0 && (int)uVar8 <= (int)uVar10) {
        fVar1 = (this->super_SELU).lambda;
        fVar2 = (this->super_SELU).alpha;
        lVar9 = 0;
        do {
          auVar13 = auVar58._0_16_;
          auVar14 = auVar59._0_16_;
          fVar40 = *(float *)(*pauVar11 + lVar9 * 4);
          if (0.0 <= fVar40) {
            fVar40 = fVar40 * (this->super_SELU).lambda;
          }
          else {
            auVar33._0_4_ = expf(fVar40);
            auVar33._4_60_ = extraout_var;
            auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
            auVar67 = ZEXT3264(auVar24);
            auVar24 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
            auVar66 = ZEXT3264(auVar24);
            auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
            auVar65 = ZEXT3264(auVar24);
            auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar64 = ZEXT3264(auVar24);
            auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
            auVar62 = ZEXT3264(auVar24);
            auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar61 = ZEXT3264(auVar24);
            auVar24 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
            auVar60 = ZEXT3264(auVar24);
            auVar14 = vxorps_avx512vl(auVar14,auVar14);
            auVar59 = ZEXT1664(auVar14);
            auVar13 = vxorps_avx512vl(auVar13,auVar13);
            auVar58 = ZEXT1664(auVar13);
            auVar13 = ZEXT416((uint)(fVar1 * fVar2));
            auVar13 = vfmsub213ss_fma(auVar33._0_16_,auVar13,auVar13);
            fVar40 = auVar13._0_4_;
            afVar45 = ::_ps512_1;
            afVar55 = ::_ps512_cephes_exp_p5;
          }
          *(float *)(*pauVar11 + lVar9 * 4) = fVar40;
          lVar9 = lVar9 + 1;
        } while (uVar10 - uVar8 != (int)lVar9);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != iVar3);
  }
  return 0;
}

Assistant:

int SELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero512 = _mm512_setzero_ps();
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        __m512 _lambda512 = _mm512_set1_ps(lambda);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);

            __m512 _pos = _mm512_max_ps(_zero512, _p);
            __m512 _neg = _mm512_min_ps(_zero512, _p);

            __m512 _blob = exp512_ps(_neg);
            _blob = _mm512_sub_ps(_blob, _one512);
            _blob = _mm512_mul_ps(_alpha512, _blob);
            _blob = _mm512_mul_ps(_lambda512, _mm512_add_ps(_pos, _blob));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero256 = _mm256_setzero_ps();
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        __m256 _lambda256 = _mm256_set1_ps(lambda);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);

            __m256 _pos = _mm256_max_ps(_zero256, _p);
            __m256 _neg = _mm256_min_ps(_zero256, _p);

            __m256 _blob = exp256_ps(_neg);
            _blob = _mm256_sub_ps(_blob, _one256);
            _blob = _mm256_mul_ps(_alpha256, _blob);
            _blob = _mm256_mul_ps(_lambda256, _mm256_add_ps(_pos, _blob));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero128 = _mm_setzero_ps();
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _alpha128 = _mm_set1_ps(alpha);
        __m128 _lambda128 = _mm_set1_ps(lambda);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);

            __m128 _pos = _mm_max_ps(_zero128, _p);
            __m128 _neg = _mm_min_ps(_zero128, _p);

            __m128 _blob = exp_ps(_neg);
            _blob = _mm_sub_ps(_blob, _one128);
            _blob = _mm_mul_ps(_alpha128, _blob);
            _blob = _mm_mul_ps(_lambda128, _mm_add_ps(_pos, _blob));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        float alphaxlambda = alpha * lambda;
        for (; i < size; i++)
        {
            // y = lambda * ( max(0, x) + min(0, alpha * (exp(x) - 1)) )
            if (*ptr < 0)
                *ptr = (expf(*ptr) - 1.f) * alphaxlambda;
            else
                *ptr = *ptr * lambda;
            ptr++;
        }
    }

    return 0;
}